

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

sexp_conflict
sexp_bytes_to_string(sexp_conflict ctx,sexp_conflict vec,sexp_uint_t offset,sexp_uint_t size)

{
  sexp_conflict psVar1;
  long in_RCX;
  sexp_uint_t in_RDX;
  double in_RSI;
  undefined8 in_RDI;
  sexp_conflict res;
  
  psVar1 = (sexp_conflict)sexp_alloc_tagged_aux(in_RDI,0x20,9);
  (psVar1->value).flonum = in_RSI;
  (psVar1->value).string.offset = in_RDX;
  (psVar1->value).type.slots = (sexp)(in_RCX - in_RDX);
  return psVar1;
}

Assistant:

sexp sexp_bytes_to_string (sexp ctx, sexp vec, sexp_uint_t offset, sexp_uint_t size) {
  sexp res;
#if SEXP_USE_PACKED_STRINGS
  res = sexp_c_string(ctx, sexp_bytes_data(vec) + offset, size);
#else
  res = sexp_alloc_type(ctx, string, SEXP_STRING);
  sexp_string_bytes(res) = vec;
  sexp_string_offset(res) = offset;
  sexp_string_size(res) = size - offset;
#endif
  return res;
}